

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall
serialize_tests::with_params_vector_of_base::test_method(with_params_vector_of_base *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  pointer pBVar3;
  long in_FS_OFFSET;
  initializer_list<serialize_tests::Base> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  ParamsWrapper<serialize_tests::BaseFormat,_std::vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>_>
  local_d0;
  undefined1 *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_> v;
  DataStream stream;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(stream.vch.
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_start._2_6_,0xff0f);
  __l._M_len = 2;
  __l._M_array = (iterator)&stream;
  std::vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>::vector
            (&v,__l,(allocator_type *)&local_d0);
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stream.m_read_pos = 0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.m_params = (BaseFormat *)&RAW;
  local_d0.m_object = &v;
  ParamsWrapper<serialize_tests::BaseFormat,_std::vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>_>
  ::Serialize<DataStream>(&local_d0,&stream);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1cb;
  file.m_begin = (iterator)&local_a0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b0,msg);
  local_d0.m_object =
       (vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_> *)
       ((ulong)local_d0.m_object & 0xffffffffffffff00);
  local_d0.m_params = (BaseFormat *)&PTR__lazy_ostream_011480b0;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_d8 = "";
  DataStream::str_abi_cxx11_(&local_58,&stream);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (&local_d0,&local_e0,0x1cb,1,2,psVar2,"stream.str()",anon_var_dwarf_fd6afa,
             "\"\\x02\\x0F\\xFF\"");
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined2 *)
   v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_d0.m_params = (BaseFormat *)&RAW;
  local_d0.m_object = &v;
  ParamsWrapper<serialize_tests::BaseFormat,_std::vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>_>
  ::Unserialize<DataStream>(&local_d0,&stream);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1d0;
  file_00.m_begin = (iterator)&local_f0;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  local_d0.m_object =
       (vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_> *)
       ((ulong)local_d0.m_object & 0xffffffffffffff00);
  local_d0.m_params = (BaseFormat *)&PTR__lazy_ostream_011480b0;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_108 = "";
  local_58._M_dataplus._M_p._0_4_ = 0xf;
  pvVar1 = (iterator)0x2;
  pBVar3 = v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>.
           _M_impl.super__Vector_impl_data._M_start;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_d0,&local_110,0x1d0,1,2,
             v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>.
             _M_impl.super__Vector_impl_data._M_start,"v[0].m_base_data",&local_58,"0x0F");
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1d1;
  file_01.m_begin = (iterator)&local_120;
  msg_01.m_end = (iterator)pBVar3;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_130,
             msg_01);
  local_d0.m_object =
       (vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_> *)
       ((ulong)local_d0.m_object & 0xffffffffffffff00);
  local_d0.m_params = (BaseFormat *)&PTR__lazy_ostream_011480b0;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_138 = "";
  pBVar3 = v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
  local_58._M_dataplus._M_p._0_4_ = 0xff;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_d0,&local_140,0x1d1,1,2,pBVar3,"v[1].m_base_data",&local_58,"0xFF");
  if (stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  stream.m_read_pos = 0;
  local_d0.m_params = (BaseFormat *)&HEX;
  local_d0.m_object = &v;
  ParamsWrapper<serialize_tests::BaseFormat,_std::vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>_>
  ::Serialize<DataStream>(&local_d0,&stream);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1d7;
  file_02.m_begin = (iterator)&local_150;
  msg_02.m_end = (iterator)pBVar3;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_160,
             msg_02);
  local_d0.m_object =
       (vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_> *)
       ((ulong)local_d0.m_object & 0xffffffffffffff00);
  local_d0.m_params = (BaseFormat *)&PTR__lazy_ostream_011480b0;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_168 = "";
  DataStream::str_abi_cxx11_(&local_58,&stream);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
            (&local_d0,&local_170,0x1d7,1,2,psVar2,"stream.str()","\x020fff","\"\\x02\" \"0fff\"");
  std::__cxx11::string::~string((string *)&local_58);
  *(undefined2 *)
   v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  local_d0.m_params = (BaseFormat *)&HEX;
  local_d0.m_object = &v;
  ParamsWrapper<serialize_tests::BaseFormat,_std::vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>_>
  ::Unserialize<DataStream>(&local_d0,&stream);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x1dc;
  file_03.m_begin = (iterator)&local_180;
  msg_03.m_end = (iterator)psVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_190,
             msg_03);
  local_d0.m_object =
       (vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_> *)
       ((ulong)local_d0.m_object & 0xffffffffffffff00);
  local_d0.m_params = (BaseFormat *)&PTR__lazy_ostream_011480b0;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_198 = "";
  local_58._M_dataplus._M_p._0_4_ = 0xf;
  pvVar1 = (iterator)0x2;
  pBVar3 = v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>.
           _M_impl.super__Vector_impl_data._M_start;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_d0,&local_1a0,0x1dc,1,2,
             v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>.
             _M_impl.super__Vector_impl_data._M_start,"v[0].m_base_data",&local_58,"0x0F");
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1dd;
  file_04.m_begin = (iterator)&local_1b0;
  msg_04.m_end = (iterator)pBVar3;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1c0,
             msg_04);
  local_d0.m_object =
       (vector<serialize_tests::Base,_std::allocator<serialize_tests::Base>_> *)
       ((ulong)local_d0.m_object & 0xffffffffffffff00);
  local_d0.m_params = (BaseFormat *)&PTR__lazy_ostream_011480b0;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_1c8 = "";
  local_58._M_dataplus._M_p._0_4_ = 0xff;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_d0,&local_1d0,0x1dd,1,2,
             v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>.
             _M_impl.super__Vector_impl_data._M_start + 1,"v[1].m_base_data",&local_58,"0xFF");
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  std::_Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>::~_Vector_base
            (&v.super__Vector_base<serialize_tests::Base,_std::allocator<serialize_tests::Base>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(with_params_vector_of_base)
{
    std::vector<Base> v{Base{0x0F}, Base{0xFF}};

    DataStream stream;

    stream << RAW(v);
    BOOST_CHECK_EQUAL(stream.str(), "\x02\x0F\xFF");

    v[0].m_base_data = 0;
    v[1].m_base_data = 0;
    stream >> RAW(v);
    BOOST_CHECK_EQUAL(v[0].m_base_data, 0x0F);
    BOOST_CHECK_EQUAL(v[1].m_base_data, 0xFF);

    stream.clear();

    stream << HEX(v);
    BOOST_CHECK_EQUAL(stream.str(), "\x02"
                                    "0fff");

    v[0].m_base_data = 0;
    v[1].m_base_data = 0;
    stream >> HEX(v);
    BOOST_CHECK_EQUAL(v[0].m_base_data, 0x0F);
    BOOST_CHECK_EQUAL(v[1].m_base_data, 0xFF);
}